

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# synthetictest.cpp
# Opt level: O2

void addChildren(node *newNode,node *originalNode,vector<node_*,_std::allocator<node_*>_> *newNodes)

{
  node *pnVar1;
  node *pnVar2;
  _Vector_base<node_*,_std::allocator<node_*>_> local_60;
  _Vector_base<node_*,_std::allocator<node_*>_> local_48;
  
  if (originalNode->left != (node *)0x0) {
    pnVar2 = createNewNode(originalNode->left->data);
    newNode->left = pnVar2;
    pnVar2->parent = newNode;
    std::vector<node_*,_std::allocator<node_*>_>::push_back(newNodes,&newNode->left);
    pnVar2 = newNode->left;
    pnVar1 = originalNode->left;
    std::vector<node_*,_std::allocator<node_*>_>::vector
              ((vector<node_*,_std::allocator<node_*>_> *)&local_48,newNodes);
    addChildren(pnVar2,pnVar1,(vector<node_*,_std::allocator<node_*>_> *)&local_48);
    std::_Vector_base<node_*,_std::allocator<node_*>_>::~_Vector_base(&local_48);
    pnVar2 = createNewNode(originalNode->right->data);
    newNode->right = pnVar2;
    pnVar2->parent = newNode;
    std::vector<node_*,_std::allocator<node_*>_>::push_back(newNodes,&newNode->right);
    pnVar2 = newNode->right;
    pnVar1 = originalNode->right;
    std::vector<node_*,_std::allocator<node_*>_>::vector
              ((vector<node_*,_std::allocator<node_*>_> *)&local_60,newNodes);
    addChildren(pnVar2,pnVar1,(vector<node_*,_std::allocator<node_*>_> *)&local_60);
    std::_Vector_base<node_*,_std::allocator<node_*>_>::~_Vector_base(&local_60);
  }
  return;
}

Assistant:

void addChildren(node* newNode, node* originalNode, std::vector<node*> newNodes)
{
    if (originalNode->left != NULL) {
        newNode->left = createNewNode(originalNode->left->data);
        newNode->left->parent = newNode;
        newNodes.push_back(newNode->left);
        
        addChildren(newNode->left, originalNode->left, newNodes);

        newNode->right = createNewNode(originalNode->right->data);
        newNode->right->parent = newNode;
        newNodes.push_back(newNode->right);

        addChildren(newNode->right, originalNode->right, newNodes);
    }
}